

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureCubeMapArraySamplingTest::iterate(TextureCubeMapArraySamplingTest *this)

{
  int iVar1;
  NotSupportedError *this_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_b98;
  MessageBuilder local_a18;
  MessageBuilder local_898;
  MessageBuilder local_718;
  MessageBuilder local_598;
  MessageBuilder local_418;
  MessageBuilder local_298;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  LogSection local_c8;
  long local_88;
  Functions *gl;
  shaderConfiguration local_70;
  shaderConfiguration local_60;
  shaderConfiguration local_50;
  shaderConfiguration local_40;
  shaderConfiguration local_30 [2];
  TextureCubeMapArraySamplingTest *local_10;
  TextureCubeMapArraySamplingTest *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture cube map array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
               ,0xc59);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  shaderConfiguration::shaderConfiguration(local_30,Compute,0,"Compute");
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
  ::push_back(&this->m_shaders,local_30);
  shaderConfiguration::shaderConfiguration(&local_40,Fragment,0,"Fragment");
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
  ::push_back(&this->m_shaders,&local_40);
  shaderConfiguration::shaderConfiguration(&local_50,Vertex,0,"Vertex");
  std::
  vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
  ::push_back(&this->m_shaders,&local_50);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 1) {
    shaderConfiguration::shaderConfiguration(&local_60,Geometry,0,"Geometry");
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::push_back(&this->m_shaders,&local_60);
  }
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 1) {
    shaderConfiguration::shaderConfiguration
              (&local_70,Tesselation_Control,(this->super_TestCaseBase).m_glExtTokens.PATCHES,
               "Tesselation_Control");
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::push_back(&this->m_shaders,&local_70);
    shaderConfiguration::shaderConfiguration
              ((shaderConfiguration *)&gl,Tesselation_Evaluation,
               (this->super_TestCaseBase).m_glExtTokens.PATCHES,"Tesselation_Evaluation");
    std::
    vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
    ::push_back(&this->m_shaders,(value_type *)&gl);
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_88 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_88 + 0x6d0))(1,&this->m_framebuffer_object_id);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 1) {
    (**(code **)(local_88 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  }
  (**(code **)(local_88 + 0xff0))(0xd05,1);
  (**(code **)(local_88 + 0xff0))(0xcf5,1);
  testFormats(this,&this->m_formats,&this->m_resolutions);
  testFormats(this,&this->m_compressed_formats,&this->m_compressed_resolutions);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 1) {
    (**(code **)(local_88 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
  }
  (**(code **)(local_88 + 0xff0))(0xd05);
  (**(code **)(local_88 + 0xff0))(0xcf5,4);
  (**(code **)(local_88 + 0x440))(1,&this->m_framebuffer_object_id);
  this->m_framebuffer_object_id = 0;
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Summary",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  tcu::LogSection::LogSection(&local_c8,&local_e8,&local_110);
  tcu::TestLog::operator<<(pTVar3,&local_c8);
  tcu::LogSection::~LogSection(&local_c8);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  if ((this->failed_cases == 0) && (this->invalid_type_cases == 0)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_298,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_298,(char (*) [38])"Test failed! Number of found errors: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->failed_cases);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_298);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_418,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_418,(char (*) [18])"Invalid shaders: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->invalid_shaders);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_418);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_598,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_598,(char (*) [19])"Invalid programs: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->invalid_programs);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_598);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_718,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_718,
                        (char (*) [69])
                        "glGetActiveUniform or glGetProgramResourceiv reported invalid type: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->invalid_type_cases);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_718);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_898,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_898,(char (*) [32])"Number of executed test cases: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->tested_cases);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_898);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_a18,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_a18,(char (*) [16])"Total shaders: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->compiled_shaders);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a18);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_b98,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_b98,(char (*) [17])"Total programs: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->linked_programs);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b98);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar3,(EndSectionToken *)&tcu::TestLog::EndSection);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureCubeMapArraySamplingTest::iterate()
{
#if TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION

	for (resolutionsVectorType::iterator resolution		= m_compressed_resolutions.begin(),
										 end_resolution = m_compressed_resolutions.end();
		 end_resolution != resolution; ++resolution)
	{
		prepareDumpForTextureCompression(*resolution);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;

#else  /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */

	if (false == m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	// These shader stages are always supported
	m_shaders.push_back(shaderConfiguration(Compute, GL_POINTS, "Compute"));
	m_shaders.push_back(shaderConfiguration(Fragment, GL_POINTS, "Fragment"));
	m_shaders.push_back(shaderConfiguration(Vertex, GL_POINTS, "Vertex"));

	// Check if geometry shader is supported
	if (true == m_is_geometry_shader_extension_supported)
	{
		m_shaders.push_back(shaderConfiguration(Geometry, GL_POINTS, "Geometry"));
	}

	// Check if tesselation shaders are supported
	if (true == m_is_tessellation_shader_supported)
	{
		m_shaders.push_back(shaderConfiguration(Tesselation_Control, m_glExtTokens.PATCHES, "Tesselation_Control"));
		m_shaders.push_back(
			shaderConfiguration(Tesselation_Evaluation, m_glExtTokens.PATCHES, "Tesselation_Evaluation"));
	}

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_framebuffer_object_id);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	testFormats(m_formats, m_resolutions);
	testFormats(m_compressed_formats, m_compressed_resolutions);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	gl.deleteFramebuffers(1, &m_framebuffer_object_id);
	m_framebuffer_object_id = 0;

	m_testCtx.getLog() << tcu::TestLog::Section("Summary", "");
	if ((0 != failed_cases) || (0 != invalid_type_cases))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! Number of found errors: " << failed_cases
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid shaders: " << invalid_shaders
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid programs: " << invalid_programs
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveUniform or glGetProgramResourceiv reported invalid type: "
						   << invalid_type_cases << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Number of executed test cases: " << tested_cases
					   << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total shaders: " << compiled_shaders << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total programs: " << linked_programs << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::EndSection;

	return STOP;
#endif /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */
}